

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoolAllocator.h
# Opt level: O3

void __thiscall btCollisionDispatcher::freeCollisionAlgorithm(btCollisionDispatcher *this,void *ptr)

{
  btPoolAllocator *pbVar1;
  
  if (ptr != (void *)0x0) {
    pbVar1 = this->m_collisionAlgorithmPoolAllocator;
    if ((pbVar1->m_pool <= ptr) &&
       (ptr < pbVar1->m_pool + (long)pbVar1->m_elemSize * (long)pbVar1->m_maxElements)) {
      *(void **)ptr = pbVar1->m_firstFree;
      pbVar1->m_firstFree = ptr;
      pbVar1->m_freeCount = pbVar1->m_freeCount + 1;
      return;
    }
  }
  btAlignedFreeInternal(ptr);
  return;
}

Assistant:

bool validPtr(void* ptr)
	{
		if (ptr) {
			if (((unsigned char*)ptr >= m_pool && (unsigned char*)ptr < m_pool + m_maxElements * m_elemSize))
			{
				return true;
			}
		}
		return false;
	}